

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::WriteStream::visitExpressions(WriteStream *this,ExpressionVisitorFn fn)

{
  bool bVar1;
  Expression *pEVar2;
  pool_ptr<soul::heart::Expression> local_38 [3];
  pool_ptr<soul::heart::Expression> local_20;
  pool_ref<soul::heart::Expression> ref;
  ExpressionVisitorFn fn_local;
  WriteStream *this_local;
  
  ref.object = (Expression *)fn;
  bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&this->element,(void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::heart::Expression>::operator->(&this->element);
    (*(pEVar2->super_Object)._vptr_Object[3])(pEVar2,ref.object);
    pool_ptr<soul::heart::Expression>::getAsPoolRef(&local_20);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              ((function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)> *)
               ref.object,(pool_ref<soul::heart::Expression> *)&local_20,read);
    pool_ref::operator_cast_to_pool_ptr((pool_ref *)local_38);
    (this->element).object = local_38[0].object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(local_38);
    pool_ref<soul::heart::Expression>::~pool_ref((pool_ref<soul::heart::Expression> *)&local_20);
  }
  pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->value);
  (*(pEVar2->super_Object)._vptr_Object[3])(pEVar2,ref.object,0);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            ((function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)> *)
             ref.object,&this->value,read);
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            if (element != nullptr)
            {
                element->visitExpressions (fn, AccessType::read);
                auto ref = element.getAsPoolRef();
                fn (ref, AccessType::read);
                element = ref;
            }

            value->visitExpressions (fn, AccessType::read);
            fn (value, AccessType::read);
        }